

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

int get_block_position(AV1_COMMON *cm,int *mi_r,int *mi_c,int blk_row,int blk_col,MV mv,
                      int sign_bias)

{
  int iVar1;
  int iVar2;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int col;
  int row;
  int col_offset;
  int row_offset;
  int base_blk_col;
  int base_blk_row;
  int blk_col_local;
  int blk_row_local;
  int *mi_c_local;
  int *mi_r_local;
  AV1_COMMON *cm_local;
  MV mv_local;
  int local_4;
  
  iVar1 = (blk_row >> 3) * 8;
  iVar2 = (blk_col >> 3) * 8;
  mv_local.row = mv.row;
  if (mv_local.row < 0) {
    local_44 = -(-(int)mv_local.row >> 6);
  }
  else {
    local_44 = (int)mv_local.row >> 6;
  }
  mv_local.col = mv.col;
  if ((int)mv < 0) {
    local_48 = -(-(int)mv_local.col >> 6);
  }
  else {
    local_48 = (int)mv_local.col >> 6;
  }
  if (sign_bias == 1) {
    local_44 = -local_44;
  }
  local_4c = blk_row + local_44;
  if (sign_bias == 1) {
    local_48 = -local_48;
  }
  local_50 = blk_col + local_48;
  if ((((local_4c < 0) || ((cm->mi_params).mi_rows >> 1 <= local_4c)) || (local_50 < 0)) ||
     ((cm->mi_params).mi_cols >> 1 <= local_50)) {
    local_4 = 0;
  }
  else if (((local_4c < iVar1) || (iVar1 + 8 <= local_4c)) ||
          ((local_50 < iVar2 + -8 || (iVar2 + 0x10 <= local_50)))) {
    local_4 = 0;
  }
  else {
    *mi_r = local_4c;
    *mi_c = local_50;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int get_block_position(AV1_COMMON *cm, int *mi_r, int *mi_c, int blk_row,
                              int blk_col, MV mv, int sign_bias) {
  const int base_blk_row = (blk_row >> 3) << 3;
  const int base_blk_col = (blk_col >> 3) << 3;

  const int row_offset = (mv.row >= 0) ? (mv.row >> (4 + MI_SIZE_LOG2))
                                       : -((-mv.row) >> (4 + MI_SIZE_LOG2));

  const int col_offset = (mv.col >= 0) ? (mv.col >> (4 + MI_SIZE_LOG2))
                                       : -((-mv.col) >> (4 + MI_SIZE_LOG2));

  const int row =
      (sign_bias == 1) ? blk_row - row_offset : blk_row + row_offset;
  const int col =
      (sign_bias == 1) ? blk_col - col_offset : blk_col + col_offset;

  if (row < 0 || row >= (cm->mi_params.mi_rows >> 1) || col < 0 ||
      col >= (cm->mi_params.mi_cols >> 1))
    return 0;

  if (row < base_blk_row - (MAX_OFFSET_HEIGHT >> 3) ||
      row >= base_blk_row + 8 + (MAX_OFFSET_HEIGHT >> 3) ||
      col < base_blk_col - (MAX_OFFSET_WIDTH >> 3) ||
      col >= base_blk_col + 8 + (MAX_OFFSET_WIDTH >> 3))
    return 0;

  *mi_r = row;
  *mi_c = col;

  return 1;
}